

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_tree.cpp
# Opt level: O1

unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true> __thiscall
duckdb::RenderTree::CreateRenderTree(RenderTree *this,Pipeline *pipeline)

{
  PhysicalOperator *pPVar1;
  _Head_base<0UL,_duckdb::PipelineRenderNode_*,_false> _Var2;
  _Head_base<0UL,_duckdb::PipelineRenderNode_*,_false> _Var3;
  pointer pPVar4;
  type op;
  _Tuple_impl<0UL,_duckdb::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>_*,_std::default_delete<duckdb::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>[]>_>
  this_00;
  type result;
  pointer *__ptr;
  pointer prVar5;
  unique_ptr<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>,_true> node
  ;
  templated_unique_single_t new_node;
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> operators;
  _Head_base<0UL,_duckdb::PipelineRenderNode_*,_false> local_60;
  _Head_base<0UL,_duckdb::PipelineRenderNode_*,_false> local_58;
  idx_t local_50;
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> local_48;
  
  Pipeline::GetOperators(&local_48,pipeline);
  local_60._M_head_impl = (pointer)0x0;
  if (local_48.
      super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    prVar5 = local_48.
             super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
             .
             super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pPVar1 = prVar5->_M_data;
      local_58._M_head_impl = (PipelineRenderNode *)operator_new(0x10);
      (local_58._M_head_impl)->op = pPVar1;
      ((local_58._M_head_impl)->child).
      super_unique_ptr<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::PipelineRenderNode_*,_std::default_delete<duckdb::PipelineRenderNode>_>
      .super__Head_base<0UL,_duckdb::PipelineRenderNode_*,_false>._M_head_impl =
           (PipelineRenderNode *)0x0;
      pPVar4 = unique_ptr<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>,_true>
               ::operator->((unique_ptr<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>,_true>
                             *)&local_58);
      _Var2._M_head_impl = local_60._M_head_impl;
      local_60._M_head_impl = (PipelineRenderNode *)0x0;
      std::
      __uniq_ptr_impl<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>_>
      ::reset((__uniq_ptr_impl<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>_>
               *)&pPVar4->child,_Var2._M_head_impl);
      _Var3._M_head_impl = local_58._M_head_impl;
      _Var2._M_head_impl = local_60._M_head_impl;
      local_58._M_head_impl = (PipelineRenderNode *)0x0;
      local_60._M_head_impl = _Var3._M_head_impl;
      if (_Var2._M_head_impl != (PipelineRenderNode *)0x0) {
        std::
        unique_ptr<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>_>::
        ~unique_ptr(&((_Var2._M_head_impl)->child).
                     super_unique_ptr<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>_>
                   );
        operator_delete(_Var2._M_head_impl);
      }
      std::unique_ptr<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>_>
      ::~unique_ptr((unique_ptr<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>_>
                     *)&local_58);
      prVar5 = prVar5 + 1;
    } while (prVar5 != local_48.
                       super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
                       .
                       super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  op = unique_ptr<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>,_true>
       ::operator*((unique_ptr<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>,_true>
                    *)&local_60);
  GetTreeWidthHeight<duckdb::PipelineRenderNode>(op,(idx_t *)&local_58,&local_50);
  this_00.
  super__Head_base<0UL,_duckdb::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>_*,_false>
  ._M_head_impl =
       (_Head_base<0UL,_duckdb::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>_*,_false>
        )operator_new(0x18);
  RenderTree((RenderTree *)
             this_00.
             super__Head_base<0UL,_duckdb::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>_*,_false>
             ._M_head_impl,(idx_t)local_58._M_head_impl,local_50);
  (this->nodes).
  super_unique_ptr<duckdb::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>[],_std::default_delete<duckdb::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>[]>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>,_std::default_delete<duckdb::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>_*,_std::default_delete<duckdb::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>[]>_>
  .
  super__Head_base<0UL,_duckdb::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>_*,_false>
       = this_00.
         super__Head_base<0UL,_duckdb::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>_*,_false>
         ._M_head_impl;
  result = unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true>::operator*
                     ((unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true>
                       *)this);
  CreateTreeRecursive<duckdb::PipelineRenderNode>(result,op,0,0);
  std::unique_ptr<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>_>::
  ~unique_ptr((unique_ptr<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>_>
               *)&local_60);
  if (local_48.
      super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return (unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>_>)
         (unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>_>)this;
}

Assistant:

unique_ptr<RenderTree> RenderTree::CreateRenderTree(const Pipeline &pipeline) {
	auto operators = pipeline.GetOperators();
	D_ASSERT(!operators.empty());
	unique_ptr<PipelineRenderNode> node;
	for (auto &op : operators) {
		auto new_node = make_uniq<PipelineRenderNode>(op.get());
		new_node->child = std::move(node);
		node = std::move(new_node);
	}
	return CreateTree<PipelineRenderNode>(*node);
}